

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_hash_update(psa_hash_operation_t *operation,uint8_t *input,size_t input_length)

{
  int local_2c;
  int ret;
  size_t input_length_local;
  uint8_t *input_local;
  psa_hash_operation_t *operation_local;
  
  if (input_length == 0) {
    operation_local._4_4_ = 0;
  }
  else {
    switch(operation->alg) {
    case 0x1000003:
      local_2c = mbedtls_md5_update_ret(&(operation->ctx).md5,input,input_length);
      break;
    case 0x1000004:
      local_2c = mbedtls_ripemd160_update_ret(&(operation->ctx).ripemd160,input,input_length);
      break;
    case 0x1000005:
      local_2c = mbedtls_sha1_update_ret(&(operation->ctx).sha1,input,input_length);
      break;
    default:
      return -0x89;
    case 0x1000008:
    case 0x1000009:
      local_2c = mbedtls_sha256_update_ret(&(operation->ctx).sha256,input,input_length);
      break;
    case 0x100000a:
    case 0x100000b:
      local_2c = mbedtls_sha512_update_ret(&(operation->ctx).sha512,input,input_length);
    }
    if (local_2c != 0) {
      psa_hash_abort(operation);
    }
    operation_local._4_4_ = mbedtls_to_psa_error(local_2c);
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_hash_update( psa_hash_operation_t *operation,
                              const uint8_t *input,
                              size_t input_length )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /* Don't require hash implementations to behave correctly on a
     * zero-length input, which may have an invalid pointer. */
    if( input_length == 0 )
        return( PSA_SUCCESS );

    switch( operation->alg )
    {
#if defined(MBEDTLS_MD2_C)
        case PSA_ALG_MD2:
            ret = mbedtls_md2_update_ret( &operation->ctx.md2,
                                          input, input_length );
            break;
#endif
#if defined(MBEDTLS_MD4_C)
        case PSA_ALG_MD4:
            ret = mbedtls_md4_update_ret( &operation->ctx.md4,
                                          input, input_length );
            break;
#endif
#if defined(MBEDTLS_MD5_C)
        case PSA_ALG_MD5:
            ret = mbedtls_md5_update_ret( &operation->ctx.md5,
                                          input, input_length );
            break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case PSA_ALG_RIPEMD160:
            ret = mbedtls_ripemd160_update_ret( &operation->ctx.ripemd160,
                                                input, input_length );
            break;
#endif
#if defined(MBEDTLS_SHA1_C)
        case PSA_ALG_SHA_1:
            ret = mbedtls_sha1_update_ret( &operation->ctx.sha1,
                                           input, input_length );
            break;
#endif
#if defined(MBEDTLS_SHA256_C)
        case PSA_ALG_SHA_224:
        case PSA_ALG_SHA_256:
            ret = mbedtls_sha256_update_ret( &operation->ctx.sha256,
                                             input, input_length );
            break;
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case PSA_ALG_SHA_384:
#endif
        case PSA_ALG_SHA_512:
            ret = mbedtls_sha512_update_ret( &operation->ctx.sha512,
                                             input, input_length );
            break;
#endif
        default:
            return( PSA_ERROR_BAD_STATE );
    }

    if( ret != 0 )
        psa_hash_abort( operation );
    return( mbedtls_to_psa_error( ret ) );
}